

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Maybe<kj::String> * __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryReadlink
          (Maybe<kj::String> *__return_storage_ptr__,InMemoryDirectory *this,PathPtr path)

{
  size_t sVar1;
  Impl *pIVar2;
  String *pSVar3;
  Own<const_kj::ReadableDirectory,_std::nullptr_t> *pOVar4;
  ReadableDirectory *pRVar5;
  StringPtr name;
  StringPtr name_00;
  PathPtr PVar6;
  Own<const_kj::ReadableDirectory,_std::nullptr_t> *subdir;
  undefined1 local_b0 [16];
  undefined1 local_a0 [8];
  OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t> _subdir1128;
  EntryImpl *entry;
  undefined1 local_70 [16];
  EntryImpl *_entry1122;
  undefined1 local_58 [8];
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Fault local_30;
  Fault f;
  InMemoryDirectory *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)path.parts.size_;
  this_local = (InMemoryDirectory *)path.parts.ptr;
  f.exception = (Exception *)this;
  path_local.parts.size_ = (size_t)__return_storage_ptr__;
  sVar1 = PathPtr::size((PathPtr *)&this_local);
  if (sVar1 == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[14]>
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x45f,FAILED,(char *)0x0,"\"not a symlink\"",(char (*) [14])"not a symlink");
    Maybe<kj::String>::Maybe(__return_storage_ptr__);
    kj::_::Debug::Fault::~Fault(&local_30);
  }
  else {
    sVar1 = PathPtr::size((PathPtr *)&this_local);
    if (sVar1 == 1) {
      MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
                ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_58,
                 &this->impl);
      pIVar2 = Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                         ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
                          local_58);
      pSVar3 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr((StringPtr *)&entry,pSVar3);
      name.content.size_ = (size_t)entry;
      name.content.ptr = (char *)pIVar2;
      Impl::tryGetEntry((Impl *)local_70,name);
      local_70._8_8_ =
           kj::_::readMaybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_const>
                     ((Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> *)
                      local_70);
      if ((EntryImpl *)local_70._8_8_ == (EntryImpl *)0x0) {
        Maybe<kj::String>::Maybe(__return_storage_ptr__);
      }
      else {
        asSymlink(__return_storage_ptr__,this,
                  (Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_58,
                  (EntryImpl *)local_70._8_8_);
      }
      _subdir1128.value.ptr._4_4_ = 1;
      Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
                ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_58);
    }
    else {
      pSVar3 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr((StringPtr *)&subdir,pSVar3);
      name_00.content.size_ = (size_t)subdir;
      name_00.content.ptr = (char *)this;
      tryGetParent((InMemoryDirectory *)local_b0,name_00);
      kj::_::readMaybe<kj::ReadableDirectory_const,decltype(nullptr)>
                ((_ *)local_a0,
                 (Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> *)local_b0);
      Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>::~Maybe
                ((Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> *)local_b0);
      pOVar4 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_a0);
      if (pOVar4 == (Own<const_kj::ReadableDirectory,_std::nullptr_t> *)0x0) {
        Maybe<kj::String>::Maybe(__return_storage_ptr__);
      }
      else {
        pOVar4 = kj::_::OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t>::operator*
                           ((OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t> *)local_a0);
        pRVar5 = Own<const_kj::ReadableDirectory,_std::nullptr_t>::operator->(pOVar4);
        sVar1 = PathPtr::size((PathPtr *)&this_local);
        PVar6 = PathPtr::slice((PathPtr *)&this_local,1,sVar1);
        (*(pRVar5->super_FsNode)._vptr_FsNode[0xc])
                  (__return_storage_ptr__,pRVar5,PVar6.parts.ptr,PVar6.parts.size_);
      }
      _subdir1128.value.ptr._4_4_ = 1;
      kj::_::OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t>::~OwnOwn
                ((OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t> *)local_a0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Maybe<String> tryReadlink(PathPtr path) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("not a symlink") { return kj::none; }
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_SOME(entry, lock->tryGetEntry(path[0])) {
        return asSymlink(lock, entry);
      } else {
        return kj::none;
      }
    }